

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_addmul_v_uint64_30_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  bool bVar1;
  ulong uVar2;
  uint i;
  int iVar3;
  bool bVar4;
  long lVar5;
  
  iVar3 = 0xf;
  uVar2 = v->w64[1] >> 0x22;
  do {
    lVar5 = 0;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      c->w64[lVar5] =
           c->w64[lVar5] ^
           A->w64[lVar5 + 2] & (long)(uVar2 << 0x3e) >> 0x3f ^
           A->w64[lVar5] & -(ulong)((uint)uVar2 & 1);
      lVar5 = 1;
      bVar1 = false;
    } while (bVar4);
    uVar2 = uVar2 >> 2;
    A = A + 1;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return;
}

Assistant:

void mzd_addmul_v_uint64_30_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word idx = CONST_BLOCK(v, 0)->w64[1] >> 34;
  for (unsigned int i = 15; i; --i, idx >>= 2, ++Ablock) {
    const word mask1 = -(idx & 1);
    const word mask2 = -((idx >> 1) & 1);
    for (unsigned int j = 0; j < 2; ++j) {
      cblock->w64[j] ^= (Ablock->w64[j] & mask1) ^ (Ablock->w64[j + 2] & mask2);
    }
  }
}